

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  size_type sVar5;
  Scalar *pSVar6;
  reference pvVar7;
  reference pvVar8;
  reference ppCVar9;
  Scalar *pSVar10;
  uint in_ECX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_R8;
  ReturnType RVar11;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  PVar12;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar13;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar14;
  int z;
  VectorNd qdd_temp_1;
  uint dofI_1;
  uint kI_1;
  Vector3d qdd_temp;
  SpatialVector Xa;
  uint lambda_3;
  uint q_index;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint lambda_2;
  uint dofI;
  uint kI;
  uint lambda_1;
  uint lambda;
  uint i_2;
  uint i_1;
  uint i;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *in_stack_fffffffffffff858;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffff860;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff868;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff870;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff878;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_fffffffffffff880;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff888;
  LhsNested in_stack_fffffffffffff8a0;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8a8;
  SpatialVector *in_stack_fffffffffffff9e0;
  SpatialTransform *in_stack_fffffffffffff9e8;
  SpatialVector *in_stack_fffffffffffffa20;
  SpatialTransform *in_stack_fffffffffffffa28;
  uint local_5d0;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_560 [40];
  uint local_538;
  uint local_534;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_4e0;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_4b0;
  non_const_type local_480;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  local_478;
  uint local_3d0;
  uint local_3cc;
  uint local_3c8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_3b8;
  uint local_2e4;
  non_const_type local_2e0;
  undefined4 local_2b0;
  uint local_2ac;
  uint local_17c;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_178;
  uint local_ac;
  non_const_type local_a8;
  uint local_34;
  uint local_30;
  uint local_2c;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *local_28;
  uint local_1c;
  long local_10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; uVar4 = (ulong)local_2c,
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish), uVar4 < sVar5;
      local_2c = local_2c + 1) {
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_10 + 0x580),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff860);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_10 + 0x598),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff860);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffff860,(Index)in_stack_fffffffffffff858);
    *pSVar6 = 0.0;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(local_10 + 0x600),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff860);
  }
  for (local_30 = 0; uVar4 = (ulong)local_30,
      sVar5 = std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::size((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
      local_30 = local_30 + 1) {
    std::vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
    ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  *)&local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff860);
  }
  for (local_34 = local_1c; local_34 != 0; local_34 = local_34 - 1) {
    if (local_34 == local_1c) {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x20),(ulong)local_34);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                (local_28,(ulong)local_34);
      Math::SpatialTransform::applyAdjoint(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator-(in_stack_fffffffffffff878);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0x580),(ulong)local_34);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    }
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
    if ((pvVar7->mDoFCount == 3) &&
       (pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34)
       , pvVar7->mJointType != JointTypeCustom)) {
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
      local_a8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                            in_stack_fffffffffffff858);
      Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>::operator-
                ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                 in_stack_fffffffffffff878);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0x580),(ulong)local_34);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>_>
                   *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(local_10 + 0x600),(ulong)local_34
                );
      Vector3_t::operator=
                ((Vector3_t *)in_stack_fffffffffffff860,
                 (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)in_stack_fffffffffffff858);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_34);
      local_ac = *pvVar8;
      if (local_ac != 0) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0x580),(ulong)local_ac);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1f),(ulong)local_34);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0x580),(ulong)local_34);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&local_8[0xf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                  ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                   &local_8[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
        local_178 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                               in_stack_fffffffffffff860,
                               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                               in_stack_fffffffffffff858);
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                  ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(local_10 + 0x600),
                   (ulong)local_34);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)in_stack_fffffffffffff880);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((SpatialVector_t *)in_stack_fffffffffffff860,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)in_stack_fffffffffffff858);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff880);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0x580),(ulong)local_ac);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff860,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffff858);
      }
    }
    else {
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&local_8[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
      if ((pvVar7->mDoFCount == 1) &&
         (pvVar7 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&local_8[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_34), pvVar7->mJointType != JointTypeCustom)) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0x580),(ulong)local_34);
        RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                 dot<Eigen::Matrix<double,6,1,0,6,1>>
                           ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_fffffffffffff860,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_fffffffffffff858);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           (in_stack_fffffffffffff860,(Index)in_stack_fffffffffffff858);
        *pSVar6 = -RVar11;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_8,(ulong)local_34);
        local_17c = *pvVar8;
        if (local_17c != 0) {
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x580),(ulong)local_17c);
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(local_8 + 0x1f),(ulong)local_34);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x580),(ulong)local_34);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &local_8[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    (in_stack_fffffffffffff860,(Index)in_stack_fffffffffffff858);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                    (in_stack_fffffffffffff8a8,(double *)in_stack_fffffffffffff8a0.m_matrix);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    (in_stack_fffffffffffff860,(Index)in_stack_fffffffffffff858);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
          ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                       *)in_stack_fffffffffffff8a8,(double *)in_stack_fffffffffffff8a0.m_matrix);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                      *)in_stack_fffffffffffff880);
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    ((SpatialVector_t *)in_stack_fffffffffffff860,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)in_stack_fffffffffffff858);
          Math::SpatialTransform::applyTranspose
                    (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff880)
          ;
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x580),(ulong)local_17c);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)in_stack_fffffffffffff860,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)in_stack_fffffffffffff858);
        }
      }
      else {
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34)
        ;
        if (pvVar7->mJointType == JointTypeCustom) {
          pvVar7 = std::
                   vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                   ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                 *)&local_8[6].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_34);
          local_2ac = pvVar7->custom_joint_index;
          ppCVar9 = std::
                    vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                  *)&local_8[0x13].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_2ac);
          local_2b0 = *(undefined4 *)(*ppCVar9 + 8);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&local_8[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_2ac);
          local_2e0 = (non_const_type)
                      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 in_stack_fffffffffffff858);
          Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::operator-
                    ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffff878);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x580),(ulong)local_34);
          Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>const>>
          ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                       *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
          std::
          vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        *)&local_8[0x13].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_2ac);
          Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                    ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff860,
                     (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)in_stack_fffffffffffff858);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (local_8,(ulong)local_34);
          local_2e4 = *pvVar8;
          if (local_2e4 != 0) {
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0x580),(ulong)local_2e4);
            std::
            vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          *)(local_8 + 0x1f),(ulong)local_34);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0x580),(ulong)local_34);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&local_8[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)local_2ac);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&local_8[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)local_2ac);
            local_3b8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   in_stack_fffffffffffff860,
                                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   in_stack_fffffffffffff858);
            std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                          *)&local_8[0x13].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)local_2ac);
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
            ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                         *)in_stack_fffffffffffff870,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffff868);
            Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_fffffffffffff888,
                       (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                        *)in_stack_fffffffffffff880);
            SpatialVector_t::
            SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                      ((SpatialVector_t *)in_stack_fffffffffffff860,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                        *)in_stack_fffffffffffff858);
            Math::SpatialTransform::applyTranspose
                      (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
            Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_fffffffffffff888,
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       in_stack_fffffffffffff880);
            std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (local_10 + 0x580),(ulong)local_2e4);
            SpatialVector_t::operator=
                      ((SpatialVector_t *)in_stack_fffffffffffff860,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                        *)in_stack_fffffffffffff858);
          }
        }
      }
    }
  }
  for (local_3bc = 0; uVar4 = (ulong)local_3bc,
      sVar5 = std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size
                        (local_28), uVar4 < sVar5; local_3bc = local_3bc + 1) {
  }
  for (local_3c0 = 0; uVar4 = (ulong)local_3c0,
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish), uVar4 < sVar5;
      local_3c0 = local_3c0 + 1) {
  }
  for (local_3c4 = 0; uVar4 = (ulong)local_3c4,
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish), uVar4 < sVar5;
      local_3c4 = local_3c4 + 1) {
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_fffffffffffff860,(Index)in_stack_fffffffffffff858);
  *pSVar6 = 0.0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             (local_10 + 0x598),0);
  SpatialVector_t::operator=
            ((SpatialVector_t *)in_stack_fffffffffffff860,
             (SpatialVector_t *)in_stack_fffffffffffff858);
  PVar13.m_rhs = (RhsNested)in_stack_fffffffffffff870;
  PVar13.m_lhs = (LhsNested)in_stack_fffffffffffff878;
  PVar14.m_rhs = (RhsNested)in_stack_fffffffffffff858;
  PVar14.m_lhs = (LhsNested)in_stack_fffffffffffff860;
  local_3c8 = 1;
  do {
    uVar4 = (ulong)local_3c8;
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (sVar5 <= uVar4) {
      return;
    }
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
    local_3cc = pvVar7->q_index;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_3c8);
    local_3d0 = *pvVar8;
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(local_8 + 0x1f),(ulong)local_3c8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_10 + 0x598),(ulong)local_3d0);
    Math::SpatialTransform::apply(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
    if ((pvVar7->mDoFCount == 3) &&
       (pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8
                             ), pvVar7->mJointType != JointTypeCustom)) {
      std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                 &local_8[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(local_10 + 0x600),
                 (ulong)local_3c8);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xf].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      local_480 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)PVar14.m_rhs);
      local_478 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *
                             )PVar14.m_lhs,
                             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)PVar14.m_rhs);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff888,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)in_stack_fffffffffffff880);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar13.m_lhs,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                  *)PVar13.m_rhs);
      Vector3_t::
      Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                ((Vector3_t *)PVar14.m_lhs,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                  *)PVar14.m_rhs);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)PVar14.m_lhs,
                           (Index)PVar14.m_rhs);
      SVar1 = *pSVar10;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar14.m_lhs
                          ,(Index)PVar14.m_rhs);
      *pSVar6 = SVar1;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)PVar14.m_lhs,
                           (Index)PVar14.m_rhs);
      SVar1 = *pSVar10;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar14.m_lhs
                          ,(Index)PVar14.m_rhs);
      *pSVar6 = SVar1;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)PVar14.m_lhs,
                           (Index)PVar14.m_rhs);
      SVar1 = *pSVar10;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar14.m_lhs
                          ,(Index)PVar14.m_rhs);
      *pSVar6 = SVar1;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      local_4b0 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)PVar14.m_lhs,
                             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar14.m_rhs);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffff880);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      SpatialVector_t::operator=
                ((SpatialVector_t *)PVar14.m_lhs,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)PVar14.m_rhs);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      local_4e0 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)PVar14.m_lhs,
                             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar14.m_rhs);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffff880);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0x598),(ulong)local_3c8);
      SpatialVector_t::operator=
                ((SpatialVector_t *)PVar14.m_lhs,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)PVar14.m_rhs);
    }
    else {
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&local_8[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      if (pvVar7->mDoFCount == 1) {
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8
                             );
        if (pvVar7->mJointType != JointTypeCustom) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              PVar14.m_lhs,(Index)PVar14.m_rhs);
          dVar2 = *pSVar6;
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &local_8[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
          RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                   dot<Eigen::Matrix<double,6,1,0,6,1>>
                             ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)PVar14.m_lhs,
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)PVar14.m_rhs);
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              PVar14.m_lhs,(Index)PVar14.m_rhs);
          dVar3 = *pSVar6;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              PVar14.m_lhs,(Index)PVar14.m_rhs);
          *pSVar6 = (dVar2 - RVar11) / dVar3;
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar14.m_lhs,
                     (Index)PVar14.m_rhs);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                    (in_stack_fffffffffffff8a8,(double *)in_stack_fffffffffffff8a0.m_matrix);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                      *)in_stack_fffffffffffff880);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_10 + 0x598),(ulong)local_3c8);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)PVar14.m_lhs,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)PVar14.m_rhs);
          goto LAB_006deaff;
        }
      }
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&local_8[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
      if (pvVar7->mJointType == JointTypeCustom) {
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8
                             );
        local_534 = pvVar7->custom_joint_index;
        ppCVar9 = std::
                  vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                *)&local_8[0x13].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)local_534);
        local_538 = *(uint *)(*ppCVar9 + 8);
        in_stack_fffffffffffff8a8 = local_560;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                  ((Index)in_stack_fffffffffffff868);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)PVar14.m_lhs,
                   (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)PVar14.m_rhs);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_534);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_534);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_534);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar14.m_rhs);
        PVar12 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)PVar14.m_lhs,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)PVar14.m_rhs);
        in_stack_fffffffffffff8a0 = PVar12.m_lhs.m_matrix;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  (in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar13.m_lhs,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)PVar13.m_rhs);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)PVar14.m_lhs,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)PVar14.m_rhs);
        local_5d0 = 0;
        while( true ) {
          if (local_538 <= local_5d0) break;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              PVar14.m_lhs,(Index)PVar14.m_rhs);
          in_stack_fffffffffffff880 =
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)*pSVar6;
          in_stack_fffffffffffff888 =
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar14.m_lhs
                          ,(Index)PVar14.m_rhs);
          *(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
            **)in_stack_fffffffffffff888 = in_stack_fffffffffffff880;
          local_5d0 = local_5d0 + 1;
        }
        in_stack_fffffffffffff868 =
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_534);
        PVar13 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar14.m_lhs,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar14.m_rhs);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)in_stack_fffffffffffff880);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3c8);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)PVar14.m_lhs,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                    *)PVar14.m_rhs);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_534);
        PVar14 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar14.m_lhs,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar14.m_rhs);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff888,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)in_stack_fffffffffffff880);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_10 + 0x598),(ulong)local_3c8);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)PVar14.m_lhs,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                    *)PVar14.m_rhs);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6deafb)
        ;
      }
    }
LAB_006deaff:
    local_3c8 = local_3c8 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}